

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cpp
# Opt level: O2

void __thiscall MyEntity::display(MyEntity *this,ostream *os)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"Hello! My name is ");
  poVar1 = std::operator<<(poVar1,(string *)&this->field_0x8);
  poVar1 = std::operator<<(poVar1," !");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

virtual void display(std::ostream &os) const {
    os << "Hello! My name is " << getName() << " !" << std::endl;
  }